

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_assign_or_expr(Parser *psr)

{
  int iVar1;
  SavedLexer saved_00;
  undefined1 auStack_30 [4];
  Tk after;
  SavedLexer saved;
  Parser *psr_local;
  
  saved.tk.field_4 = (anon_union_8_2_0c43866c_for_TkInfo_4)psr;
  lex_save((SavedLexer *)auStack_30,&psr->lxr);
  lex_next((Lexer *)(saved.tk.field_4.ident_hash + 8));
  iVar1 = *(int *)(saved.tk.field_4.ident_hash + 0x28);
  saved_00.tk.type = saved.cursor;
  saved_00.tk.start = saved.line;
  saved_00.cursor = (int)auStack_30;
  saved_00.line = after;
  saved_00.tk.length = saved.tk.type;
  saved_00.tk.line = saved.tk.start;
  saved_00.tk.field_4 = (anon_union_8_2_0c43866c_for_TkInfo_4)saved.tk._8_8_;
  lex_restore((Lexer *)(saved.tk.field_4.ident_hash + 8),saved_00);
  if ((iVar1 == 0x3d) || ((0x100 < iVar1 && (iVar1 < 0x106)))) {
    parse_assign((Parser *)saved.tk.field_4);
  }
  else {
    parse_expr((Parser *)saved.tk.field_4);
  }
  return;
}

Assistant:

static void parse_assign_or_expr(Parser *psr) {
	// Get the token after the identifier
	SavedLexer saved = lex_save(&psr->lxr);
	lex_next(&psr->lxr);
	Tk after = psr->lxr.tk.type;
	lex_restore(&psr->lxr, saved);

	// Inspect the token
	if (after == '=' || (after >= TK_ADD_ASSIGN && after <= TK_MOD_ASSIGN)) {
		parse_assign(psr);
	} else {
		// Throw away the result of the expression since we don't use it
		parse_expr(psr);
	}
}